

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmCacheManager *pcVar1;
  cmState *pcVar2;
  bool bVar3;
  bool bVar4;
  WorkingMode WVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  cmGlobalGenerator *pcVar9;
  cmGlobalUnixMakefileGenerator3 *this_00;
  ulong uVar10;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar11;
  cmMakefile *this_02;
  char *local_5b0;
  allocator local_541;
  string local_540;
  byte local_51b;
  byte local_51a;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  cmMakefile *local_4d0;
  cmMakefile *mf;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  char *local_450;
  char *makeProgram;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350 [8];
  string message_2;
  string local_328;
  char *local_308;
  char *tsName;
  string local_2f8;
  allocator local_2d1;
  string local_2d0 [8];
  string message_1;
  string local_2a8;
  char *local_288;
  char *platformName;
  allocator local_259;
  string local_258;
  string local_238 [39];
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [8];
  string message;
  string local_178 [39];
  allocator local_151;
  string local_150;
  char *local_130;
  char *genName;
  string local_120;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string fullName;
  string local_b0;
  char *local_90;
  char *extraGenName;
  string local_80;
  char *local_60;
  char *genName_1;
  allocator local_41;
  string local_40;
  int local_1c;
  cmake *pcStack_18;
  int res;
  cmake *this_local;
  
  pcStack_18 = this;
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  local_1c = 0;
  WVar5 = GetWorkingMode(this);
  if (WVar5 == NORMAL_MODE) {
    local_1c = DoPreConfigureChecks(this);
  }
  if (local_1c < 0) {
    this_local._4_4_ = -2;
  }
  else {
    if (local_1c == 0) {
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"CMAKE_HOME_DIRECTORY",&local_41);
      pcVar7 = GetHomeDirectory(this);
      cmCacheManager::AddCacheEntry
                (pcVar1,&local_40,pcVar7,
                 "Source directory with the top level CMakeLists.txt file for this project",INTERNAL
                );
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,"CMAKE_GENERATOR",(allocator *)((long)&extraGenName + 7));
      pcVar7 = cmCacheManager::GetInitializedCacheValue(pcVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName + 7));
      pcVar1 = this->CacheManager;
      local_60 = pcVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b0,"CMAKE_EXTRA_GENERATOR",
                 (allocator *)(fullName.field_2._M_local_buf + 0xf));
      pcVar8 = cmCacheManager::GetInitializedCacheValue(pcVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      pcVar7 = local_60;
      local_90 = pcVar8;
      if (local_60 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,pcVar7,&local_f9);
        if (local_90 == (char *)0x0) {
          local_5b0 = "";
        }
        else {
          local_5b0 = local_90;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,local_5b0,(allocator *)((long)&genName + 7));
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_d8,&local_f8,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)((long)&genName + 7));
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        pcVar9 = CreateGlobalGenerator(this,(string *)local_d8);
        this->GlobalGenerator = pcVar9;
        std::__cxx11::string::~string((string *)local_d8);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        this_00 = (cmGlobalUnixMakefileGenerator3 *)operator_new(0x668);
        cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(this_00,this);
        SetGlobalGenerator(this,(cmGlobalGenerator *)this_00);
      }
      else {
        bVar3 = cmGlobalGenerator::GetForceUnixPaths(this->GlobalGenerator);
        cmSystemTools::SetForceUnixPaths(bVar3);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
        return -1;
      }
    }
    pcVar1 = this->CacheManager;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"CMAKE_GENERATOR",&local_151);
    pcVar7 = cmCacheManager::GetInitializedCacheValue(pcVar1,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    local_130 = pcVar7;
    if (pcVar7 != (char *)0x0) {
      pcVar9 = this->GlobalGenerator;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_178,pcVar7,(allocator *)(message.field_2._M_local_buf + 0xf));
      iVar6 = (*pcVar9->_vptr_cmGlobalGenerator[3])(pcVar9,local_178);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
      if ((((byte)iVar6 ^ 0xff) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a0,"Error: generator : ",&local_1a1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(local_1c8);
        std::__cxx11::string::operator+=(local_1a0,local_1c8);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::operator+=
                  (local_1a0,"\nDoes not match the generator used previously: ");
        std::__cxx11::string::operator+=(local_1a0,local_130);
        std::__cxx11::string::operator+=
                  (local_1a0,
                   "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._4_4_ = -2;
        std::__cxx11::string::~string(local_1a0);
        return this_local._4_4_;
      }
    }
    pcVar1 = this->CacheManager;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"CMAKE_GENERATOR",&local_1e9);
    pcVar7 = cmCacheManager::GetInitializedCacheValue(pcVar1,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    if (pcVar7 == (char *)0x0) {
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"CMAKE_GENERATOR",&local_211);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(local_238);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCacheManager::AddCacheEntry(pcVar1,&local_210,pcVar7,"Name of generator.",INTERNAL);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,"CMAKE_EXTRA_GENERATOR",&local_259);
      cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
                ((string *)&platformName,this->GlobalGenerator);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCacheManager::AddCacheEntry
                (pcVar1,&local_258,pcVar7,"Name of external makefile project generator.",INTERNAL);
      std::__cxx11::string::~string((string *)&platformName);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
    }
    pcVar1 = this->CacheManager;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2a8,"CMAKE_GENERATOR_PLATFORM",
               (allocator *)(message_1.field_2._M_local_buf + 0xf));
    pcVar7 = cmCacheManager::GetInitializedCacheValue(pcVar1,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    local_288 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2f8,"CMAKE_GENERATOR_PLATFORM",(allocator *)((long)&tsName + 7));
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCacheManager::AddCacheEntry(pcVar1,&local_2f8,pcVar7,"Name of generator platform.",INTERNAL)
      ;
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tsName + 7));
    }
    else {
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        bVar3 = std::operator!=(&this->GeneratorPlatform,local_288);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2d0,"Error: generator platform: ",&local_2d1);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
          std::__cxx11::string::operator+=(local_2d0,(string *)&this->GeneratorPlatform);
          std::__cxx11::string::operator+=
                    (local_2d0,"\nDoes not match the platform used previously: ");
          std::__cxx11::string::operator+=(local_2d0,local_288);
          std::__cxx11::string::operator+=
                    (local_2d0,
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._4_4_ = -2;
          std::__cxx11::string::~string(local_2d0);
          return this_local._4_4_;
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&this->GeneratorPlatform,local_288);
      }
    }
    pcVar1 = this->CacheManager;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_328,"CMAKE_GENERATOR_TOOLSET",
               (allocator *)(message_2.field_2._M_local_buf + 0xf));
    pcVar7 = cmCacheManager::GetInitializedCacheValue(pcVar1,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
    local_308 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_378,"CMAKE_GENERATOR_TOOLSET",&local_379);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCacheManager::AddCacheEntry(pcVar1,&local_378,pcVar7,"Name of generator toolset.",INTERNAL);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
    }
    else {
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        bVar3 = std::operator!=(&this->GeneratorToolset,local_308);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_350,"Error: generator toolset: ",&local_351);
          std::allocator<char>::~allocator((allocator<char> *)&local_351);
          std::__cxx11::string::operator+=(local_350,(string *)&this->GeneratorToolset);
          std::__cxx11::string::operator+=
                    (local_350,"\nDoes not match the toolset used previously: ");
          std::__cxx11::string::operator+=(local_350,local_308);
          std::__cxx11::string::operator+=
                    (local_350,
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._4_4_ = -2;
          std::__cxx11::string::~string(local_350);
          return this_local._4_4_;
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&this->GeneratorToolset,local_308);
      }
    }
    bVar3 = cmState::GetIsInTryCompile(this->State);
    if (!bVar3) {
      cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
      TruncateOutputLog(this,"CMakeOutput.log");
      TruncateOutputLog(this,"CMakeError.log");
    }
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[7])();
    pcVar2 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"CMAKE_BACKWARDS_COMPATIBILITY",&local_3a1);
    pcVar7 = cmState::GetInitializedCacheValue(pcVar2,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    if (pcVar7 != (char *)0x0) {
      pcVar2 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c8,"LIBRARY_OUTPUT_PATH",&local_3c9);
      pcVar7 = cmState::GetInitializedCacheValue(pcVar2,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      if (pcVar7 == (char *)0x0) {
        pcVar2 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3f0,"LIBRARY_OUTPUT_PATH",&local_3f1);
        cmState::AddCacheEntry
                  (pcVar2,&local_3f0,"","Single output directory for building all libraries.",PATH);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      }
      pcVar2 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_418,"EXECUTABLE_OUTPUT_PATH",&local_419);
      pcVar7 = cmState::GetInitializedCacheValue(pcVar2,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      if (pcVar7 == (char *)0x0) {
        pcVar2 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_440,"EXECUTABLE_OUTPUT_PATH",
                   (allocator *)((long)&makeProgram + 7));
        cmState::AddCacheEntry
                  (pcVar2,&local_440,"","Single output directory for building all executables.",PATH
                  );
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator((allocator<char> *)((long)&makeProgram + 7));
      }
    }
    bVar3 = cmSystemTools::GetFatalErrorOccured();
    if (bVar3) {
      pcVar2 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_470,"CMAKE_MAKE_PROGRAM",&local_471);
      pcVar7 = cmState::GetInitializedCacheValue(pcVar2,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
      local_450 = pcVar7;
      if ((pcVar7 == (char *)0x0) || (bVar3 = cmSystemTools::IsOff(pcVar7), bVar3)) {
        pcVar2 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_498,"CMAKE_GENERATOR",&local_499);
        cmState::RemoveCacheEntry(pcVar2,&local_498);
        std::__cxx11::string::~string((string *)&local_498);
        std::allocator<char>::~allocator((allocator<char> *)&local_499);
        pcVar2 = this->State;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_4c0,"CMAKE_EXTRA_GENERATOR",(allocator *)((long)&mf + 7));
        cmState::RemoveCacheEntry(pcVar2,&local_4c0);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
      }
    }
    this_01 = cmGlobalGenerator::GetLocalGenerators(this->GlobalGenerator);
    ppcVar11 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                         (this_01,0);
    this_02 = cmLocalGenerator::GetMakefile(*ppcVar11);
    local_4d0 = this_02;
    std::allocator<char>::allocator();
    local_51a = 0;
    local_51b = 0;
    std::__cxx11::string::string((string *)&local_4f0,"CTEST_USE_LAUNCHERS",&local_4f1);
    bVar4 = cmMakefile::IsOn(this_02,&local_4f0);
    bVar3 = false;
    if (bVar4) {
      pcVar2 = this->State;
      std::allocator<char>::allocator();
      local_51a = 1;
      std::__cxx11::string::string((string *)&local_518,"RULE_LAUNCH_COMPILE",&local_519);
      local_51b = 1;
      pcVar7 = cmState::GetGlobalProperty(pcVar2,&local_518);
      bVar3 = pcVar7 == (char *)0x0;
    }
    if ((local_51b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_518);
    }
    if ((local_51a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
    }
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    if (bVar3) {
      cmSystemTools::Error
                ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                 ,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    WVar5 = GetWorkingMode(this);
    if (WVar5 == NORMAL_MODE) {
      pcVar1 = this->CacheManager;
      pcVar7 = GetHomeOutputDirectory(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_540,pcVar7,&local_541);
      cmCacheManager::SaveCache(pcVar1,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator((allocator<char> *)&local_541);
    }
    bVar3 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar3) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = 0;
  if ( this->GetWorkingMode() == NORMAL_MODE )
    {
    res = this->DoPreConfigureChecks();
    }
  if ( res < 0 )
    {
    return -2;
    }
  if ( !res )
    {
    this->CacheManager->AddCacheEntry
      ("CMAKE_HOME_DIRECTORY",
       this->GetHomeDirectory(),
       "Source directory with the top level CMakeLists.txt file for this "
       "project",
       cmState::INTERNAL);
    }

  // no generator specified on the command line
  if(!this->GlobalGenerator)
    {
    const char* genName =
      this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR");
    const char* extraGenName =
      this->CacheManager->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if(genName)
      {
      std::string fullName = cmExternalMakefileProjectGenerator::
                                CreateFullGeneratorName(genName,
                                    extraGenName ? extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
      }
    if(this->GlobalGenerator)
      {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths
        (this->GlobalGenerator->GetForceUnixPaths());
      }
    else
      {
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
      std::string installedCompiler;
      // Try to find the newest VS installed on the computer and
      // use that as a default if -G is not specified
      const std::string vsregBase =
        "[HKEY_LOCAL_MACHINE\\SOFTWARE\\Microsoft\\";
      std::vector<std::string> vsVerions;
      vsVerions.push_back("VisualStudio\\");
      vsVerions.push_back("VCExpress\\");
      vsVerions.push_back("WDExpress\\");
      struct VSRegistryEntryName
      {
        const char* MSVersion;
        const char* GeneratorName;
      };
      VSRegistryEntryName version[] = {
        {"6.0", "Visual Studio 6"},
        {"7.0", "Visual Studio 7"},
        {"7.1", "Visual Studio 7 .NET 2003"},
        {"8.0", "Visual Studio 8 2005"},
        {"9.0", "Visual Studio 9 2008"},
        {"10.0", "Visual Studio 10 2010"},
        {"11.0", "Visual Studio 11 2012"},
        {"12.0", "Visual Studio 12 2013"},
        {"14.0", "Visual Studio 14 2015"},
        {0, 0}};
      for(int i=0; version[i].MSVersion != 0; i++)
        {
        for(size_t b=0; b < vsVerions.size(); b++)
          {
          std::string reg = vsregBase + vsVerions[b] + version[i].MSVersion;
          reg += ";InstallDir]";
          cmSystemTools::ExpandRegistryValues(reg,
                                              cmSystemTools::KeyWOW64_32);
          if (!(reg == "/registry"))
            {
            installedCompiler = version[i].GeneratorName;
            break;
            }
          }
        }
      cmGlobalGenerator* gen
        = this->CreateGlobalGenerator(installedCompiler.c_str());
      if(!gen)
        {
        gen = new cmGlobalNMakeMakefileGenerator(this);
        }
      this->SetGlobalGenerator(gen);
      std::cout << "-- Building for: " << gen->GetName() << "\n";
#else
      this->SetGlobalGenerator(new cmGlobalUnixMakefileGenerator3(this));
#endif
      }
    if(!this->GlobalGenerator)
      {
      cmSystemTools::Error("Could not create generator");
      return -1;
      }
    }

  const char* genName = this->CacheManager
                            ->GetInitializedCacheValue("CMAKE_GENERATOR");
  if(genName)
    {
    if(!this->GlobalGenerator->MatchesGeneratorName(genName))
      {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += genName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  if(!this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR"))
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR",
                                      this->GlobalGenerator->GetName().c_str(),
                                      "Name of generator.",
                                      cmState::INTERNAL);
    this->CacheManager->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmState::INTERNAL);
    }

  if(const char* platformName =
     this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM"))
    {
    if(this->GeneratorPlatform.empty())
      {
      this->GeneratorPlatform = platformName;
      }
    else if(this->GeneratorPlatform != platformName)
      {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += platformName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                                      this->GeneratorPlatform.c_str(),
                                      "Name of generator platform.",
                                      cmState::INTERNAL);
    }

  if(const char* tsName =
     this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET"))
    {
    if(this->GeneratorToolset.empty())
      {
      this->GeneratorToolset = tsName;
      }
    else if(this->GeneratorToolset != tsName)
      {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += tsName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                                      this->GeneratorToolset.c_str(),
                                      "Name of generator toolset.",
                                      cmState::INTERNAL);
    }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile())
    {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
    }

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if(this->State
         ->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY"))
    {
    if(!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH"))
      {
      this->State->AddCacheEntry
        ("LIBRARY_OUTPUT_PATH", "",
         "Single output directory for building all libraries.",
         cmState::PATH);
      }
    if(!this->State
            ->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH"))
      {
      this->State->AddCacheEntry
        ("EXECUTABLE_OUTPUT_PATH", "",
         "Single output directory for building all executables.",
         cmState::PATH);
      }
    }

  if(cmSystemTools::GetFatalErrorOccured())
    {
    const char* makeProgram =
        this->State->GetInitializedCacheValue("CMAKE_MAKE_PROGRAM");
    if (!makeProgram || cmSystemTools::IsOff(makeProgram))
      {
      // We must have a bad generator selection.  Wipe the cache entry so the
      // user can select another.
      this->State->RemoveCacheEntry("CMAKE_GENERATOR");
      this->State->RemoveCacheEntry("CMAKE_EXTRA_GENERATOR");
      }
    }

  cmMakefile* mf=this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  if (mf->IsOn("CTEST_USE_LAUNCHERS")
              && !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE"))
    {
    cmSystemTools::Error("CTEST_USE_LAUNCHERS is enabled, but the "
                        "RULE_LAUNCH_COMPILE global property is not defined.\n"
                        "Did you forget to include(CTest) in the toplevel "
                         "CMakeLists.txt ?");
    }

  // only save the cache if there were no fatal errors
  if ( this->GetWorkingMode() == NORMAL_MODE )
    {
    this->CacheManager->SaveCache(this->GetHomeOutputDirectory());
    }
  if(cmSystemTools::GetErrorOccuredFlag())
    {
    return -1;
    }
  return 0;
}